

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

TPZSkylMatrix<std::complex<double>_> * __thiscall
TPZSkylMatrix<std::complex<double>_>::operator*
          (TPZSkylMatrix<std::complex<double>_> *this,complex<double> value)

{
  int iVar1;
  undefined4 extraout_var;
  TPZSkylMatrix<std::complex<double>_> *in_RSI;
  TPZSkylMatrix<std::complex<double>_> *in_RDI;
  int64_t i;
  complex<double> *elemRes;
  int64_t colsize;
  int64_t col;
  TPZSkylMatrix<std::complex<double>_> *res;
  complex<double> *in_stack_ffffffffffffff78;
  TPZSkylMatrix<std::complex<double>_> *this_00;
  TPZSkylMatrix<std::complex<double>_> *pTVar2;
  long local_58;
  complex<double> *__z;
  complex<double> *in_stack_ffffffffffffffc0;
  TPZSkylMatrix<std::complex<double>_> *local_30;
  
  pTVar2 = in_RDI;
  TPZSkylMatrix(in_RSI,in_RDI);
  local_30 = (TPZSkylMatrix<std::complex<double>_> *)0x0;
  while (this_00 = local_30,
        iVar1 = (*(in_RSI->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                  super_TPZSavable._vptr_TPZSavable[0xc])(),
        (long)this_00 < CONCAT44(extraout_var,iVar1)) {
    in_stack_ffffffffffffff78 = (complex<double> *)Size(this_00,(int64_t)in_stack_ffffffffffffff78);
    __z = in_stack_ffffffffffffff78;
    TPZVec<std::complex<double>_*>::operator[](&in_RDI->fElem,(int64_t)local_30);
    for (local_58 = 0; local_58 < (long)__z; local_58 = local_58 + 1) {
      std::complex<double>::operator*=(in_stack_ffffffffffffffc0,__z);
    }
    local_30 = (TPZSkylMatrix<std::complex<double>_> *)
               ((long)&(local_30->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                       super_TPZSavable._vptr_TPZSavable + 1);
  }
  return pTVar2;
}

Assistant:

TPZSkylMatrix<TVar>
TPZSkylMatrix<TVar>::operator*(const TVar value ) const
{
	auto res(*this);
	
	for ( int64_t col = 0; col < this->Dim(); col++ )
    {
		// Aloca nova coluna para o resultado.
		int64_t colsize = Size(col);
		// Efetua a SOMA.
		TVar *elemRes  = res.fElem[col];
		for ( int64_t i = 0; i < colsize; i++ )
			*elemRes++ *= value;
    }
	
	return res;
}